

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

string * __thiscall
CoreML::dimensionRangesToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *rangePerDimension,
          bool useArrayFormat)

{
  CoreML *this_00;
  ulong uVar1;
  char *__s;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 in_R8B;
  string local_208;
  ulong local_1e8;
  size_t i;
  allocator<char> local_1c9;
  string local_1c8 [8];
  string separator;
  stringstream ss;
  ostream local_198 [383];
  byte local_19;
  CoreML *pCStack_18;
  bool useArrayFormat_local;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *rangePerDimension_local;
  
  local_19 = (byte)rangePerDimension & 1;
  pCStack_18 = this;
  rangePerDimension_local =
       (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
       __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  __s = anon_var_dwarf_3cd44b;
  if ((local_19 & 1) != 0) {
    __s = ", ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c8,__s,&local_1c9);
  std::allocator<char>::~allocator(&local_1c9);
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"[");
  }
  local_1e8 = 0;
  while( true ) {
    uVar1 = local_1e8;
    sVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       pCStack_18);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                       ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                        pCStack_18,local_1e8);
    this_00 = (CoreML *)pvVar3->first;
    pvVar3 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::operator[]
                       ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                        pCStack_18,local_1e8);
    rangeToString_abi_cxx11_(&local_208,this_00,pvVar3->second,(ulong)(local_19 & 1),(bool)in_R8B);
    std::operator<<(local_198,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    uVar1 = local_1e8;
    sVar2 = std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::size
                      ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
                       pCStack_18);
    if (uVar1 < sVar2 - 1) {
      std::operator<<(local_198,local_1c8);
    }
    local_1e8 = local_1e8 + 1;
  }
  if ((local_19 & 1) != 0) {
    std::operator<<(local_198,"]");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)(separator.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static std::string dimensionRangesToString(const std::vector<std::pair<int64_t,int64_t>> &rangePerDimension, bool useArrayFormat = false) {
        std::stringstream ss;
        std::string separator = useArrayFormat ? ", " : " × ";

        if (useArrayFormat) {
            ss << "[";
        }

        for (size_t i = 0; i < rangePerDimension.size(); i++) {
            ss << rangeToString(rangePerDimension[i].first,rangePerDimension[i].second,useArrayFormat);
            if (i < rangePerDimension.size() - 1) { ss << separator; }
        }

        if (useArrayFormat) {
            ss << "]";
        }

        return ss.str();
    }